

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Vec_Int_t * Gia_VtaFramesToAbs(Vec_Vec_t *vFrames)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *pVVar3;
  int local_30;
  int nSize;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vAbs;
  Vec_Int_t *vOne;
  Vec_Vec_t *vFrames_local;
  
  iVar1 = Vec_VecSize(vFrames);
  iVar2 = Vec_VecSizeSize(vFrames);
  p = Vec_IntAlloc(iVar1 + 2 + iVar2);
  iVar1 = Vec_VecSize(vFrames);
  Vec_IntPush(p,iVar1);
  local_30 = Vec_VecSize(vFrames);
  local_30 = local_30 + 2;
  for (Entry = 0; iVar1 = Vec_VecSize(vFrames), Entry < iVar1; Entry = Entry + 1) {
    pVVar3 = Vec_VecEntryInt(vFrames,Entry);
    Vec_IntPush(p,local_30);
    iVar1 = Vec_IntSize(pVVar3);
    local_30 = iVar1 + local_30;
  }
  Vec_IntPush(p,local_30);
  iVar1 = Vec_IntSize(p);
  iVar2 = Vec_VecSize(vFrames);
  if (iVar1 != iVar2 + 2) {
    __assert_fail("Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0xc1,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
  }
  for (Entry = 0; iVar1 = Vec_VecSize(vFrames), Entry < iVar1; Entry = Entry + 1) {
    pVVar3 = Vec_VecEntryInt(vFrames,Entry);
    for (nSize = 0; iVar1 = Vec_IntSize(pVVar3), nSize < iVar1; nSize = nSize + 1) {
      iVar1 = Vec_IntEntry(pVVar3,nSize);
      Vec_IntPush(p,iVar1);
    }
  }
  iVar1 = Vec_IntEntry(p,0);
  iVar1 = Vec_IntEntry(p,iVar1 + 1);
  iVar2 = Vec_IntSize(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0xc5,"Vec_Int_t *Gia_VtaFramesToAbs(Vec_Vec_t *)");
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_VtaFramesToAbs( Vec_Vec_t * vFrames )
{
    Vec_Int_t * vOne, * vAbs;
    int i, k, Entry, nSize;
    vAbs = Vec_IntAlloc( 2 + Vec_VecSize(vFrames) + Vec_VecSizeSize(vFrames) );
    Vec_IntPush( vAbs, Vec_VecSize(vFrames) );
    nSize = Vec_VecSize(vFrames) + 2;
    Vec_VecForEachLevelInt( vFrames, vOne, i )
    {
        Vec_IntPush( vAbs, nSize );
        nSize += Vec_IntSize( vOne );
    }
    Vec_IntPush( vAbs, nSize );
    assert( Vec_IntSize(vAbs) == Vec_VecSize(vFrames) + 2 );
    Vec_VecForEachLevelInt( vFrames, vOne, i )
        Vec_IntForEachEntry( vOne, Entry, k )
            Vec_IntPush( vAbs, Entry );
    assert( Vec_IntEntry(vAbs, Vec_IntEntry(vAbs,0)+1) == Vec_IntSize(vAbs) );
    return vAbs;
}